

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_arena.pb.cc
# Opt level: O2

size_t __thiscall proto2_arena_unittest::ArenaMessage::ByteSizeLong(ArenaMessage *this)

{
  void **ppvVar1;
  const_iterator cVar2;
  size_t sVar3;
  size_t sVar4;
  
  sVar4 = (size_t)*(int *)((long)&this->field_0 + 8);
  ppvVar1 = google::protobuf::internal::RepeatedPtrFieldBase::elements
                      ((RepeatedPtrFieldBase *)&(this->field_0)._impl_);
  cVar2 = google::protobuf::RepeatedPtrField<proto2_arena_unittest::NestedMessage>::end
                    (&(this->field_0)._impl_.repeated_nested_message_);
  for (; ppvVar1 != cVar2.it_; ppvVar1 = ppvVar1 + 1) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSize<proto2_arena_unittest::NestedMessage>((NestedMessage *)*ppvVar1);
    sVar4 = sVar4 + sVar3;
  }
  sVar4 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar4,&(this->field_0)._impl_._cached_size_);
  return sVar4;
}

Assistant:

::size_t ArenaMessage::ByteSizeLong() const {
  const ArenaMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_arena_unittest.ArenaMessage)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .proto2_arena_unittest.NestedMessage repeated_nested_message = 1;
    {
      total_size += 1UL * this_._internal_repeated_nested_message_size();
      for (const auto& msg : this_._internal_repeated_nested_message()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}